

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void procFix(void)

{
  int iVar1;
  int iVar2;
  procFixStruct *ppVar3;
  instrStruct *piVar4;
  int iVar5;
  instrStruct *piVar6;
  
  piVar4 = firstInstr;
  ppVar3 = procFixList->next;
  while( true ) {
    if (ppVar3 == (procFixStruct *)0x0) {
      return;
    }
    iVar1 = ppVar3->proc->val;
    if (iVar1 < 0) break;
    iVar2 = ppVar3->pos;
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    iVar5 = iVar5 + 1;
    piVar6 = piVar4;
    do {
      piVar6 = piVar6->next;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    piVar6->instr = (iVar1 - iVar2) % bigNum + (piVar6->instr - piVar6->instr % bigNum);
    ppVar3 = ppVar3->next;
  }
  mark("found lonley prototype");
  exit(-1);
}

Assistant:

procedure 
void procFix(void) {
	variable struct procFixStruct *list;
	list = procFixList->next;
	while (list != NULL) {
		if (list->proc->val < 0) {
			mark("found lonley prototype");
			exit(-1);
		} else {
			fix(list->pos,list->proc->val - list->pos);
		}
		list = list->next;
	}
}